

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O0

float __thiscall OpenMD::StringTokenizer::nextTokenAsFloat(StringTokenizer *this)

{
  char *__nptr;
  string *in_RDI;
  double dVar1;
  string token;
  StringTokenizer *in_stack_00000058;
  StringTokenizer *this_00;
  
  this_00 = (StringTokenizer *)&stack0xffffffffffffffd8;
  nextToken_abi_cxx11_(in_stack_00000058);
  convertFortranNumber(this_00,in_RDI);
  __nptr = (char *)std::__cxx11::string::c_str();
  dVar1 = atof(__nptr);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  return (float)dVar1;
}

Assistant:

float StringTokenizer::nextTokenAsFloat() {
    std::string token = nextToken();
    convertFortranNumber(token);
    return (float)(atof(token.c_str()));
  }